

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int havingToWhereExprCb(Walker *pWalker,Expr *pExpr)

{
  Select *pSVar1;
  sqlite3 *db_00;
  int iVar2;
  Expr *pEVar3;
  undefined1 local_88 [8];
  Expr t;
  Expr *pWhere;
  Expr *pNew;
  sqlite3 *db;
  Select *pS;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  if (pExpr->op == ',') {
    pWalker_local._4_4_ = 0;
  }
  else {
    pSVar1 = (pWalker->u).pSelect;
    iVar2 = sqlite3ExprIsConstantOrGroupBy(pWalker->pParse,pExpr,pSVar1->pGroupBy);
    if (iVar2 != 0) {
      db_00 = pWalker->pParse->db;
      pEVar3 = sqlite3ExprAlloc(db_00,0x93,sqlite3IntTokens + 1,0);
      if (pEVar3 != (Expr *)0x0) {
        t.y = (anon_union_8_3_c79b3df9_for_y)pSVar1->pWhere;
        memcpy(local_88,pEVar3,0x48);
        memcpy(pEVar3,pExpr,0x48);
        memcpy(pExpr,local_88,0x48);
        pEVar3 = sqlite3ExprAnd(db_00,(Expr *)t.y.pTab,pEVar3);
        pSVar1->pWhere = pEVar3;
        pWalker->eCode = '\x01';
      }
    }
    pWalker_local._4_4_ = 1;
  }
  return pWalker_local._4_4_;
}

Assistant:

static int havingToWhereExprCb(Walker *pWalker, Expr *pExpr){
  if( pExpr->op!=TK_AND ){
    Select *pS = pWalker->u.pSelect;
    if( sqlite3ExprIsConstantOrGroupBy(pWalker->pParse, pExpr, pS->pGroupBy) ){
      sqlite3 *db = pWalker->pParse->db;
      Expr *pNew = sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[1], 0);
      if( pNew ){
        Expr *pWhere = pS->pWhere;
        SWAP(Expr, *pNew, *pExpr);
        pNew = sqlite3ExprAnd(db, pWhere, pNew);
        pS->pWhere = pNew;
        pWalker->eCode = 1;
      }
    }
    return WRC_Prune;
  }
  return WRC_Continue;
}